

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

long cs_impl::to_integer_if<cni_root_namespace::foo_t,_false>::to_integer(foo_t *param_1)

{
  error *this;
  string local_38;
  
  this = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000M","");
  cov::error::error(this,&local_38);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

static long to_integer(const T &)
		{
			throw cov::error("E000M");
		}